

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::
SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
::reallocateTo(SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer p;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pvVar9;
  long lVar10;
  
  pvVar9 = (pointer)operator_new(newCapacity * 0x30);
  p = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&(p->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&(p->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10 + 0x10);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&(p->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10 + 0x20);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(pvVar9->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10 + 0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)
               ((long)&(pvVar9->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10 + 0x10);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)
               ((long)&(pvVar9->
                       super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       ).
                       super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       .
                       super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
               + lVar10);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar10 = lVar10 + 0x30;
    } while (sVar3 * 0x30 != lVar10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = pvVar9;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }